

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean breakarm(permonst *ptr)

{
  boolean bVar1;
  byte local_11;
  permonst *ptr_local;
  
  if (((2 < ptr->msize) ||
      (((1 < ptr->msize && ((ptr->mflags1 & 0x20000) == 0)) || (ptr == mons + 0x133)))) ||
     (local_11 = 0, ptr == mons + 0x2b)) {
    bVar1 = sliparm(ptr);
    local_11 = bVar1 != '\0' ^ 0xff;
  }
  return local_11 & 1;
}

Assistant:

boolean breakarm(const struct permonst *ptr)
{
	return ((bigmonst(ptr) || (ptr->msize > MZ_SMALL && !humanoid(ptr)) ||
		/* special cases of humanoids that cannot wear body armor */
		ptr == &mons[PM_MARILITH] || ptr == &mons[PM_WINGED_GARGOYLE])
	      && !sliparm(ptr));
}